

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x99d618;
  *(undefined8 *)&this->field_0xc8 = 0x99d6b8;
  *(undefined8 *)&this->field_0x10 = 0x99d640;
  *(undefined8 *)&this->field_0x70 = 0x99d668;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x99d690;
  puVar1 = *(undefined1 **)
            &(this->
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>).
             field_0x20;
  if (puVar1 != &this->field_0xb0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x99d830;
  *(undefined8 *)&this->field_0xc8 = 0x99d880;
  *(undefined8 *)&this->field_0x10 = 0x99d858;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48);
  }
  if (*(void **)&this->field_0x30 != (void *)0x0) {
    operator_delete(*(void **)&this->field_0x30);
    return;
  }
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}